

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O1

uint * Kit_TruthIsop_rec(uint *puOn,uint *puOnDc,int nVars,Kit_Sop_t *pcRes,Vec_Int_t *vStore)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  byte bVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int nVars_00;
  int iVar18;
  Kit_Sop_t cRes1;
  Kit_Sop_t cRes0;
  Kit_Sop_t cRes2;
  Kit_Sop_t local_68;
  Kit_Sop_t local_58;
  ulong local_48;
  Kit_Sop_t local_40;
  
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  local_48 = (ulong)uVar4;
  lVar5 = (long)vStore->nSize + local_48;
  iVar18 = (int)lVar5;
  vStore->nSize = iVar18;
  iVar14 = vStore->nCap;
  uVar17 = (ulong)uVar4;
  if (iVar14 < iVar18) {
    puVar6 = (uint *)0x0;
  }
  else {
    puVar6 = (uint *)(vStore->pArray + (lVar5 - uVar17));
  }
  uVar13 = uVar17;
  if (puVar6 == (uint *)0x0) {
LAB_005d0cd2:
    pcRes->nCubes = -1;
    return (uint *)0x0;
  }
  do {
    uVar9 = uVar13;
    if ((long)uVar9 < 1) goto LAB_005d0c5b;
    uVar13 = uVar9 - 1;
  } while (puOn[uVar9 - 1] == 0);
  uVar13 = uVar17;
  if ((long)uVar9 < 1) {
LAB_005d0c5b:
    pcRes->nLits = 0;
    pcRes->nCubes = 0;
    pcRes->pCubes = (uint *)0x0;
    iVar14 = 0;
  }
  else {
    do {
      uVar9 = uVar13;
      if ((long)uVar9 < 1) goto LAB_005d0c84;
      uVar13 = uVar9 - 1;
    } while (puOnDc[uVar9 - 1] == 0xffffffff);
    if (0 < (long)uVar9) {
      if (nVars < 1) {
        __assert_fail("nVars > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                      ,0x107,
                      "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                     );
      }
      iVar14 = nVars * 2;
      iVar18 = nVars;
      do {
        nVars_00 = iVar18;
        iVar14 = iVar14 + -2;
        if (nVars_00 < 1) {
          __assert_fail("Var >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                        ,0x10d,
                        "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                       );
        }
        iVar18 = nVars_00 + -1;
        iVar3 = Kit_TruthVarInSupport(puOn,nVars,iVar18);
      } while ((iVar3 == 0) && (iVar3 = Kit_TruthVarInSupport(puOnDc,nVars,iVar18), iVar3 == 0));
      if (nVars_00 < 6) {
        uVar4 = Kit_TruthIsop5_rec(*puOn,*puOnDc,nVars_00,pcRes,vStore);
        uVar13 = 0;
        do {
          puVar6[uVar13] = uVar4;
          uVar13 = uVar13 + 1;
        } while (uVar17 != uVar13);
        return puVar6;
      }
      bVar12 = (char)nVars_00 - 6;
      uVar17 = (ulong)(uint)(1 << (bVar12 & 0x1f));
      lVar5 = uVar17 + 1;
      lVar16 = 0;
      do {
        puVar6[uVar17 + lVar16 + -1] =
             ~puOnDc[uVar17 * 2 + lVar16 + -1] & puOn[uVar17 + lVar16 + -1];
        lVar1 = lVar5 + lVar16;
        lVar16 = lVar16 + -1;
      } while (1 < lVar1 + -1);
      puVar7 = Kit_TruthIsop_rec(puVar6,puOnDc,iVar18,&local_58,vStore);
      if (local_58.nCubes != 0xffffffff) {
        lVar16 = uVar17 * 8;
        do {
          lVar16 = lVar16 + -4;
          *(uint *)((long)puVar6 + lVar16) = ~puOnDc[lVar5 + -2] & *(uint *)((long)puOn + lVar16);
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
        puVar8 = Kit_TruthIsop_rec(puVar6 + uVar17,puOnDc + uVar17,iVar18,&local_68,vStore);
        uVar13 = uVar17;
        if (local_68.nCubes != 0xffffffff) {
          do {
            uVar9 = uVar13 - 1;
            puVar6[uVar9] = ~puVar7[uVar9] & puOn[uVar9];
            bVar2 = 1 < (long)uVar13;
            uVar13 = uVar9;
          } while (bVar2);
          lVar5 = uVar17 + 1;
          lVar16 = uVar17 * 8;
          do {
            lVar16 = lVar16 + -4;
            *(uint *)((long)puVar6 + lVar16) = ~puVar8[lVar5 + -2] & *(uint *)((long)puOn + lVar16);
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
          lVar5 = uVar17 + 1;
          puVar10 = puVar6 + uVar17 * 2;
          do {
            puVar10 = puVar10 + -1;
            puVar6[lVar5 + -2] = puVar6[lVar5 + -2] | *puVar10;
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
          lVar5 = uVar17 + 1;
          lVar16 = uVar17 * 2;
          do {
            lVar16 = lVar16 + -1;
            puVar6[lVar16] = puOnDc[lVar16] & puOnDc[lVar5 + -2];
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
          puVar10 = Kit_TruthIsop_rec(puVar6,puVar6 + uVar17,iVar18,&local_40,vStore);
          if ((ulong)(uint)local_40.nCubes != 0xffffffff) {
            pcRes->nLits = local_58.nLits + local_68.nCubes + local_58.nCubes + local_68.nLits +
                           local_40.nLits;
            iVar18 = local_40.nCubes + local_68.nCubes + local_58.nCubes;
            pcRes->nCubes = iVar18;
            puVar11 = Vec_IntFetch(vStore,iVar18);
            pcRes->pCubes = puVar11;
            if (puVar11 == (uint *)0x0) {
              pcRes->nCubes = -1;
              return (uint *)0x0;
            }
            if (local_58.nCubes < 1) {
              uVar13 = 0;
            }
            else {
              uVar13 = 0;
              do {
                puVar11[uVar13] = local_58.pCubes[uVar13] | 1 << ((byte)iVar14 & 0x1f);
                uVar13 = uVar13 + 1;
              } while ((uint)local_58.nCubes != uVar13);
            }
            if (0 < local_68.nCubes) {
              uVar9 = 0;
              do {
                puVar11[(uVar13 & 0xffffffff) + uVar9] =
                     local_68.pCubes[uVar9] | 2 << ((byte)iVar14 & 0x1f);
                uVar9 = uVar9 + 1;
              } while ((uint)local_68.nCubes != uVar9);
              uVar13 = (ulong)(uint)((int)uVar13 + (int)uVar9);
            }
            iVar14 = (int)uVar13;
            if (0 < local_40.nCubes) {
              uVar9 = 0;
              do {
                puVar11[(uVar13 & 0xffffffff) + uVar9] = local_40.pCubes[uVar9];
                uVar9 = uVar9 + 1;
              } while ((uint)local_40.nCubes != uVar9);
              iVar14 = iVar14 + (int)uVar9;
            }
            uVar13 = uVar17;
            if (iVar14 != pcRes->nCubes) {
              __assert_fail("k == pcRes->nCubes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitIsop.c"
                            ,0x145,
                            "unsigned int *Kit_TruthIsop_rec(unsigned int *, unsigned int *, int, Kit_Sop_t *, Vec_Int_t *)"
                           );
            }
            do {
              uVar9 = uVar13 - 1;
              puVar6[uVar9] = puVar10[uVar9] | puVar7[uVar9];
              bVar2 = 1 < (long)uVar13;
              uVar13 = uVar9;
            } while (bVar2);
            puVar7 = puVar6 + uVar17 * 2;
            lVar5 = uVar17 + 1;
            do {
              puVar7 = puVar7 + -1;
              *puVar7 = puVar10[lVar5 + -2] | puVar8[lVar5 + -2];
              lVar5 = lVar5 + -1;
            } while (1 < lVar5);
            uVar4 = 2 << (bVar12 & 0x1f);
            uVar15 = (uint)local_48 >> ((char)nVars_00 - 5U & 0x1f);
            if (1 < uVar15) {
              uVar17 = 1;
              puVar7 = puVar6;
              do {
                puVar7 = puVar7 + uVar4;
                if (0 < (int)uVar4) {
                  uVar13 = 0;
                  do {
                    puVar7[uVar13] = puVar6[uVar13];
                    uVar13 = uVar13 + 1;
                  } while (uVar4 != uVar13);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar15);
              return puVar6;
            }
            return puVar6;
          }
        }
      }
      pcRes->nCubes = -1;
      return (uint *)0x0;
    }
LAB_005d0c84:
    pcRes->nLits = 0;
    pcRes->nCubes = 1;
    vStore->nSize = iVar18 + 1;
    if (iVar18 < iVar14) {
      puVar7 = (uint *)(vStore->pArray + (long)(iVar18 + 1) + -1);
    }
    else {
      puVar7 = (uint *)0x0;
    }
    pcRes->pCubes = puVar7;
    if (puVar7 == (uint *)0x0) goto LAB_005d0cd2;
    *puVar7 = 0;
    iVar14 = 0xff;
  }
  puVar6 = (uint *)memset(puVar6,iVar14,(ulong)(uVar4 - 1) * 4 + 4);
  return puVar6;
}

Assistant:

unsigned * Kit_TruthIsop_rec( unsigned * puOn, unsigned * puOnDc, int nVars, Kit_Sop_t * pcRes, Vec_Int_t * vStore )
{
    Kit_Sop_t cRes0, cRes1, cRes2;
    Kit_Sop_t * pcRes0 = &cRes0, * pcRes1 = &cRes1, * pcRes2 = &cRes2;
    unsigned * puRes0, * puRes1, * puRes2;
    unsigned * puOn0, * puOn1, * puOnDc0, * puOnDc1, * pTemp, * pTemp0, * pTemp1;
    int i, k, Var, nWords, nWordsAll;
//    assert( Kit_TruthIsImply( puOn, puOnDc, nVars ) );
    // allocate room for the resulting truth table
    nWordsAll = Kit_TruthWordNum( nVars );
    pTemp = Vec_IntFetch( vStore, nWordsAll );
    if ( pTemp == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // check for constants
    if ( Kit_TruthIsConst0( puOn, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 0;
        pcRes->pCubes = NULL;
        Kit_TruthClear( pTemp, nVars );
        return pTemp;
    }
    if ( Kit_TruthIsConst1( puOnDc, nVars ) )
    {
        pcRes->nLits  = 0;
        pcRes->nCubes = 1;
        pcRes->pCubes = Vec_IntFetch( vStore, 1 );
        if ( pcRes->pCubes == NULL )
        {
            pcRes->nCubes = -1;
            return NULL;
        }
        pcRes->pCubes[0] = 0;
        Kit_TruthFill( pTemp, nVars );
        return pTemp;
    }
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Kit_TruthVarInSupport( puOn, nVars, Var ) || 
             Kit_TruthVarInSupport( puOnDc, nVars, Var ) )
             break;
    assert( Var >= 0 );
    // consider a simple case when one-word computation can be used
    if ( Var < 5 )
    {
        unsigned uRes = Kit_TruthIsop5_rec( puOn[0], puOnDc[0], Var+1, pcRes, vStore );
        for ( i = 0; i < nWordsAll; i++ )
            pTemp[i] = uRes;
        return pTemp;
    }
    assert( Var >= 5 );
    nWords = Kit_TruthWordNum( Var );
    // cofactor
    puOn0   = puOn;    puOn1   = puOn + nWords;
    puOnDc0 = puOnDc;  puOnDc1 = puOnDc + nWords;
    pTemp0  = pTemp;   pTemp1  = pTemp + nWords;
    // solve for cofactors
    Kit_TruthSharp( pTemp0, puOn0, puOnDc1, Var );
    puRes0 = Kit_TruthIsop_rec( pTemp0, puOnDc0, Var, pcRes0, vStore );
    if ( pcRes0->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp1, puOn1, puOnDc0, Var );
    puRes1 = Kit_TruthIsop_rec( pTemp1, puOnDc1, Var, pcRes1, vStore );
    if ( pcRes1->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    Kit_TruthSharp( pTemp0, puOn0, puRes0, Var );
    Kit_TruthSharp( pTemp1, puOn1, puRes1, Var );
    Kit_TruthOr( pTemp0, pTemp0, pTemp1, Var );
    Kit_TruthAnd( pTemp1, puOnDc0, puOnDc1, Var );
    puRes2 = Kit_TruthIsop_rec( pTemp0, pTemp1, Var, pcRes2, vStore );
    if ( pcRes2->nCubes == -1 )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    // create the resulting cover
    pcRes->nLits  = pcRes0->nLits  + pcRes1->nLits  + pcRes2->nLits + pcRes0->nCubes + pcRes1->nCubes;
    pcRes->nCubes = pcRes0->nCubes + pcRes1->nCubes + pcRes2->nCubes;
    pcRes->pCubes = Vec_IntFetch( vStore, pcRes->nCubes );
    if ( pcRes->pCubes == NULL )
    {
        pcRes->nCubes = -1;
        return NULL;
    }
    k = 0;
    for ( i = 0; i < pcRes0->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes0->pCubes[i] | (1 << ((Var<<1)+0));
    for ( i = 0; i < pcRes1->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes1->pCubes[i] | (1 << ((Var<<1)+1));
    for ( i = 0; i < pcRes2->nCubes; i++ )
        pcRes->pCubes[k++] = pcRes2->pCubes[i];
    assert( k == pcRes->nCubes );
    // create the resulting truth table
    Kit_TruthOr( pTemp0, puRes0, puRes2, Var );
    Kit_TruthOr( pTemp1, puRes1, puRes2, Var );
    // copy the table if needed
    nWords <<= 1;
    for ( i = 1; i < nWordsAll/nWords; i++ )
        for ( k = 0; k < nWords; k++ )
            pTemp[i*nWords + k] = pTemp[k];
    // verify in the end
//    assert( Kit_TruthIsImply( puOn, pTemp, nVars ) );
//    assert( Kit_TruthIsImply( pTemp, puOnDc, nVars ) );
    return pTemp;
}